

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall
llvm::APInt::toString
          (APInt *this,SmallVectorImpl<char> *Str,uint Radix,bool Signed,bool formatAsCLiteral)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  char *in_end;
  size_t sVar4;
  uint64_t *puVar5;
  ulong uVar6;
  uint local_104;
  ulong local_d8;
  uint64_t Digit_1;
  uint local_c8;
  uint Digit;
  uint MaskAmt;
  uint ShiftAmt;
  uint StartDig;
  APInt Tmp;
  int64_t I;
  uint64_t N;
  char *BufPtr;
  char Buffer [65];
  char *Prefix;
  bool formatAsCLiteral_local;
  bool Signed_local;
  uint Radix_local;
  SmallVectorImpl<char> *Str_local;
  APInt *this_local;
  
  if ((((Radix == 10) || (Radix == 8)) || (Radix == 0x10)) ||
     ((Radix == 2 || (bVar3 = false, Radix == 0x24)))) {
    bVar3 = true;
  }
  if (bVar3) {
    stack0xffffffffffffffc0 = "";
    if (formatAsCLiteral) {
      switch(Radix) {
      case 2:
        stack0xffffffffffffffc0 = "0b";
        break;
      default:
        llvm_unreachable_internal
                  ("Invalid radix!",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                   ,0x7f5);
      case 8:
        stack0xffffffffffffffc0 = "0";
        break;
      case 10:
        break;
      case 0x10:
        stack0xffffffffffffffc0 = "0x";
      }
    }
    bVar3 = operator==(this,0);
    if (bVar3) {
      for (; *stack0xffffffffffffffc0 != '\0'; register0x00000000 = stack0xffffffffffffffc0 + 1) {
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,stack0xffffffffffffffc0);
      }
      Buffer[0x3f] = '0';
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,Buffer + 0x3f);
    }
    else {
      bVar3 = isSingleWord(this);
      if (bVar3) {
        N = (uint64_t)std::end<char,65ul>((char (*) [65])&BufPtr);
        if (Signed) {
          I = getSExtValue(this);
          if (I < 0) {
            Tmp._15_1_ = 0x2d;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Str->super_SmallVectorTemplateBase<char,_true>,&Tmp.field_0xf);
            I = -I;
          }
        }
        else {
          I = getZExtValue(this);
        }
        for (; *stack0xffffffffffffffc0 != '\0'; register0x00000000 = stack0xffffffffffffffc0 + 1) {
          SmallVectorTemplateBase<char,_true>::push_back
                    (&Str->super_SmallVectorTemplateBase<char,_true>,stack0xffffffffffffffc0);
        }
        for (; I != 0; I = (ulong)I / (ulong)Radix) {
          *(char *)(N - 1) = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(ulong)I % (ulong)Radix];
          N = N - 1;
        }
        in_end = std::end<char,65ul>((char (*) [65])&BufPtr);
        SmallVectorImpl<char>::append<char*,void>(Str,(char *)N,in_end);
      }
      else {
        APInt((APInt *)&StartDig,this);
        if ((Signed) && (bVar3 = isNegative(this), bVar3)) {
          negate((APInt *)&StartDig);
          ShiftAmt._3_1_ = 0x2d;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)((long)&ShiftAmt + 3));
        }
        for (; *stack0xffffffffffffffc0 != '\0'; register0x00000000 = stack0xffffffffffffffc0 + 1) {
          SmallVectorTemplateBase<char,_true>::push_back
                    (&Str->super_SmallVectorTemplateBase<char,_true>,stack0xffffffffffffffc0);
        }
        sVar4 = SmallVectorBase::size((SmallVectorBase *)Str);
        MaskAmt = (uint)sVar4;
        if (((Radix == 2) || (Radix == 8)) || (Radix == 0x10)) {
          if (Radix == 0x10) {
            local_104 = 4;
          }
          else {
            local_104 = 1;
            if (Radix == 8) {
              local_104 = 3;
            }
          }
          Digit = local_104;
          local_c8 = Radix - 1;
          while (bVar3 = getBoolValue((APInt *)&StartDig), bVar3) {
            puVar5 = getRawData((APInt *)&StartDig);
            Digit_1._4_4_ = (uint)*puVar5 & local_c8;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Str->super_SmallVectorTemplateBase<char,_true>,
                       "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + Digit_1._4_4_);
            lshrInPlace((APInt *)&StartDig,Digit);
          }
        }
        else {
          while (bVar3 = getBoolValue((APInt *)&StartDig), bVar3) {
            udivrem((APInt *)&StartDig,(ulong)Radix,(APInt *)&StartDig,&local_d8);
            if (Radix <= local_d8) {
              __assert_fail("Digit < Radix && \"divide failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                            ,0x846,
                            "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                           );
            }
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Str->super_SmallVectorTemplateBase<char,_true>,
                       "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + local_d8);
          }
        }
        pvVar1 = (Str->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        uVar6 = (ulong)MaskAmt;
        pvVar2 = (Str->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar4 = SmallVectorBase::size((SmallVectorBase *)Str);
        std::reverse<char*>((char *)((long)pvVar1 + uVar6),(char *)((long)pvVar2 + sVar4));
        ~APInt((APInt *)&StartDig);
      }
    }
    return;
  }
  __assert_fail("(Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 || Radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x7e2,
                "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
               );
}

Assistant:

void APInt::toString(SmallVectorImpl<char> &Str, unsigned Radix,
                     bool Signed, bool formatAsCLiteral) const {
  assert((Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 ||
          Radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  const char *Prefix = "";
  if (formatAsCLiteral) {
    switch (Radix) {
      case 2:
        // Binary literals are a non-standard extension added in gcc 4.3:
        // http://gcc.gnu.org/onlinedocs/gcc-4.3.0/gcc/Binary-constants.html
        Prefix = "0b";
        break;
      case 8:
        Prefix = "0";
        break;
      case 10:
        break; // No prefix
      case 16:
        Prefix = "0x";
        break;
      default:
        llvm_unreachable("Invalid radix!");
    }
  }

  // First, check for a zero value and just short circuit the logic below.
  if (*this == 0) {
    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };
    Str.push_back('0');
    return;
  }

  static const char Digits[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";

  if (isSingleWord()) {
    char Buffer[65];
    char *BufPtr = std::end(Buffer);

    uint64_t N;
    if (!Signed) {
      N = getZExtValue();
    } else {
      int64_t I = getSExtValue();
      if (I >= 0) {
        N = I;
      } else {
        Str.push_back('-');
        N = -(uint64_t)I;
      }
    }

    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };

    while (N) {
      *--BufPtr = Digits[N % Radix];
      N /= Radix;
    }
    Str.append(BufPtr, std::end(Buffer));
    return;
  }

  APInt Tmp(*this);

  if (Signed && isNegative()) {
    // They want to print the signed version and it is a negative value
    // Flip the bits and add one to turn it into the equivalent positive
    // value and put a '-' in the result.
    Tmp.negate();
    Str.push_back('-');
  }

  while (*Prefix) {
    Str.push_back(*Prefix);
    ++Prefix;
  };

  // We insert the digits backward, then reverse them to get the right order.
  unsigned StartDig = Str.size();

  // For the 2, 8 and 16 bit cases, we can just shift instead of divide
  // because the number of bits per digit (1, 3 and 4 respectively) divides
  // equally.  We just shift until the value is zero.
  if (Radix == 2 || Radix == 8 || Radix == 16) {
    // Just shift tmp right for each digit width until it becomes zero
    unsigned ShiftAmt = (Radix == 16 ? 4 : (Radix == 8 ? 3 : 1));
    unsigned MaskAmt = Radix - 1;

    while (Tmp.getBoolValue()) {
      unsigned Digit = unsigned(Tmp.getRawData()[0]) & MaskAmt;
      Str.push_back(Digits[Digit]);
      Tmp.lshrInPlace(ShiftAmt);
    }
  } else {
    while (Tmp.getBoolValue()) {
      uint64_t Digit;
      udivrem(Tmp, Radix, Tmp, Digit);
      assert(Digit < Radix && "divide failed");
      Str.push_back(Digits[Digit]);
    }
  }

  // Reverse the digits before returning.
  std::reverse(Str.begin()+StartDig, Str.end());
}